

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.hpp
# Opt level: O2

unique_ptr<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>_>
__thiscall
TasGrid::GridReaderVersion5<TasGrid::GridLocalPolynomial>::read<TasGrid::IO::mode_ascii_type>
          (GridReaderVersion5<TasGrid::GridLocalPolynomial> *this,AccelerationContext *acc,
          istream *is)

{
  uint uVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  TypeOneDRule rule;
  erule eVar5;
  int iVar6;
  unsigned_long num_entries;
  int *piVar7;
  int in_R8D;
  allocator_type local_61;
  MultiIndexSet local_60;
  AccelerationContext *acc_local;
  
  acc_local = acc;
  Utils::make_unique<TasGrid::GridLocalPolynomial,TasGrid::AccelerationContext_const*&>
            ((Utils *)this,&acc_local);
  iVar4 = IO::readNumber<TasGrid::IO::mode_ascii_type,int>(is);
  *(int *)(*(long *)this + 0x10) = iVar4;
  iVar4 = IO::readNumber<TasGrid::IO::mode_ascii_type,int>(is);
  *(int *)(*(long *)this + 0x14) = iVar4;
  iVar4 = IO::readNumber<TasGrid::IO::mode_ascii_type,int>(is);
  *(int *)(*(long *)this + 0x90) = iVar4;
  iVar4 = IO::readNumber<TasGrid::IO::mode_ascii_type,int>(is);
  *(int *)(*(long *)this + 0x94) = iVar4;
  rule = IO::readRule<TasGrid::IO::mode_ascii_type>(is);
  eVar5 = RuleLocal::getEffectiveRule(*(int *)(*(long *)this + 0x90),rule);
  *(erule *)(*(long *)this + 0x130) = eVar5;
  bVar3 = IO::readFlag<TasGrid::IO::mode_ascii_type>(is);
  if (bVar3) {
    MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_ascii_type>(&local_60,is);
    MultiIndexSet::operator=((MultiIndexSet *)(*(long *)this + 0x18),&local_60);
    ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&local_60.indexes.super__Vector_base<int,_std::allocator<int>_>);
  }
  bVar3 = IO::readFlag<TasGrid::IO::mode_ascii_type>(is);
  if (bVar3) {
    IO::readData2D<TasGrid::IO::mode_ascii_type,double,int,int>
              ((Data2D<double> *)&local_60,(IO *)is,
               (istream *)(ulong)*(uint *)(*(long *)this + 0x14),*(int *)(*(long *)this + 0x20),
               in_R8D);
    Data2D<double>::operator=((Data2D<double> *)(*(long *)this + 0x98),(Data2D<double> *)&local_60);
    ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&local_60.indexes);
  }
  bVar3 = IO::readFlag<TasGrid::IO::mode_ascii_type>(is);
  if (bVar3) {
    MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_ascii_type>(&local_60,is);
    MultiIndexSet::operator=((MultiIndexSet *)(*(long *)this + 0x40),&local_60);
    ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&local_60.indexes.super__Vector_base<int,_std::allocator<int>_>);
  }
  iVar4 = *(int *)(*(long *)this + 0x130);
  bVar3 = IO::readFlag<TasGrid::IO::mode_ascii_type>(is);
  if (bVar3) {
    IO::readData2D<TasGrid::IO::mode_ascii_type,int,int,int>
              ((Data2D<int> *)&local_60,(IO *)is,
               (istream *)
               (ulong)(uint)(*(int *)(*(long *)this + 0x10) << ((iVar4 - 1U & 0xfffffffd) != 0)),
               *(int *)(*(long *)this + 0x20),in_R8D);
    Data2D<int>::operator=((Data2D<int> *)(*(long *)this + 0xc0),(Data2D<int> *)&local_60);
    ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&local_60.indexes.super__Vector_base<int,_std::allocator<int>_>);
  }
  lVar2 = *(long *)this;
  num_entries = *(unsigned_long *)(lVar2 + 0x28);
  piVar7 = (int *)(lVar2 + 0x20);
  if (num_entries == *(unsigned_long *)(lVar2 + 0x30)) {
    piVar7 = (int *)(lVar2 + 0x48);
  }
  iVar4 = *piVar7;
  iVar6 = IO::readNumber<TasGrid::IO::mode_ascii_type,int>(is);
  ::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_60,(long)iVar6,&local_61);
  ::std::vector<int,_std::allocator<int>_>::_M_move_assign
            ((vector<int,_std::allocator<int>_> *)(*(long *)this + 0xe8),&local_60);
  ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_60);
  lVar2 = *(long *)this;
  if (*(long *)(lVar2 + 0xf0) != *(long *)(lVar2 + 0xe8)) {
    IO::readVector<TasGrid::IO::mode_ascii_type,int>
              (is,(vector<int,_std::allocator<int>_> *)(lVar2 + 0xe8));
    IO::readVector<TasGrid::IO::mode_ascii_type,int,unsigned_long>
              ((vector<int,_std::allocator<int>_> *)&local_60,(IO *)is,(istream *)((long)iVar4 + 1),
               num_entries);
    iVar6 = (int)num_entries;
    ::std::vector<int,_std::allocator<int>_>::_M_move_assign
              ((vector<int,_std::allocator<int>_> *)(*(long *)this + 0x100),&local_60);
    ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_60);
    uVar1 = *(uint *)(*(long *)(*(long *)this + 0x100) + (long)iVar4 * 4);
    if ((int)uVar1 < 1) {
      IO::readVector<TasGrid::IO::mode_ascii_type,int,int>
                ((vector<int,_std::allocator<int>_> *)&local_60,(IO *)is,(istream *)0x1,iVar6);
    }
    else {
      IO::readVector<TasGrid::IO::mode_ascii_type,int,int>
                ((vector<int,_std::allocator<int>_> *)&local_60,(IO *)is,(istream *)(ulong)uVar1,
                 iVar6);
    }
    ::std::vector<int,_std::allocator<int>_>::_M_move_assign
              ((vector<int,_std::allocator<int>_> *)(*(long *)this + 0x118),&local_60);
    ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_60);
  }
  if (0 < *(int *)(*(long *)this + 0x14)) {
    StorageSet::StorageSet<TasGrid::IO::mode_ascii_type>((StorageSet *)&local_60,is);
    StorageSet::operator=((StorageSet *)(*(long *)this + 0x68),(StorageSet *)&local_60);
    ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&local_60.indexes);
  }
  return (__uniq_ptr_data<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>,_true,_true>
          )(__uniq_ptr_data<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>,_true,_true>
            )this;
}

Assistant:

static std::unique_ptr<GridLocalPolynomial> read(AccelerationContext const *acc, std::istream &is){
        std::unique_ptr<GridLocalPolynomial> grid = Utils::make_unique<GridLocalPolynomial>(acc);

            grid->num_dimensions = IO::readNumber<iomode, int>(is);
            grid->num_outputs = IO::readNumber<iomode, int>(is);
            grid->order = IO::readNumber<iomode, int>(is);
            grid->top_level = IO::readNumber<iomode, int>(is);
            TypeOneDRule rule = IO::readRule<iomode>(is);
            grid->effective_rule = RuleLocal::getEffectiveRule(grid->order, rule);

            if (IO::readFlag<iomode>(is)) grid->points = MultiIndexSet(is, iomode());
            if (std::is_same<iomode, IO::mode_ascii_type>::value){ // backwards compatible: surpluses and needed, or needed and surpluses
                if (IO::readFlag<iomode>(is))
                    grid->surpluses = IO::readData2D<iomode, double>(is, grid->num_outputs, grid->points.getNumIndexes());
                if (IO::readFlag<iomode>(is)) grid->needed = MultiIndexSet(is, iomode());
            }else{
                if (IO::readFlag<iomode>(is)) grid->needed = MultiIndexSet(is, iomode());
                if (IO::readFlag<iomode>(is))
                    grid->surpluses = IO::readData2D<iomode, double>(is, grid->num_outputs, grid->points.getNumIndexes());
            }
            int max_parents = [&]()->int {
                    switch(grid->effective_rule) {
                        case RuleLocal::erule::pwc: return RuleLocal::getMaxNumParents<RuleLocal::erule::pwc>();
                        case RuleLocal::erule::localp: return RuleLocal::getMaxNumParents<RuleLocal::erule::localp>();
                        case RuleLocal::erule::semilocalp: return RuleLocal::getMaxNumParents<RuleLocal::erule::semilocalp>();
                        case RuleLocal::erule::localp0: return RuleLocal::getMaxNumParents<RuleLocal::erule::localp0>();
                        default: // case RuleLocal::erule::localpb:
                            return RuleLocal::getMaxNumParents<RuleLocal::erule::localpb>();
                    };
                }();

            if (IO::readFlag<iomode>(is))
                grid->parents = IO::readData2D<iomode, int>(is, max_parents * grid->num_dimensions, grid->points.getNumIndexes());

            size_t num_points = (size_t) ((grid->points.empty()) ? grid->needed.getNumIndexes() : grid->points.getNumIndexes());
            grid->roots = std::vector<int>((size_t) IO::readNumber<iomode, int>(is));
            if (grid->roots.size() > 0){
                IO::readVector<iomode>(is, grid->roots);
                grid->pntr = IO::readVector<iomode, int>(is, num_points + 1);
                if (grid->pntr[num_points] > 0){
                    grid->indx = IO::readVector<iomode, int>(is, grid->pntr[num_points]);
                }else{
                    grid->indx = IO::readVector<iomode, int>(is, 1);
                }
            }

            if (grid->num_outputs > 0) grid->values = StorageSet(is, iomode());

        return grid;
    }